

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O2

void ncnn_mat_destroy(ncnn_mat_t mat)

{
  int *piVar1;
  
  if ((mat != (ncnn_mat_t)0x0) && (piVar1 = *(int **)(mat + 8), piVar1 != (int *)0x0)) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (*(long **)(mat + 0x20) == (long *)0x0) {
        free(*(void **)mat);
      }
      else {
        (**(code **)(**(long **)(mat + 0x20) + 0x18))();
      }
    }
  }
  operator_delete(mat,0x48);
  return;
}

Assistant:

void ncnn_mat_destroy(ncnn_mat_t mat)
{
    delete (Mat*)mat;
}